

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O3

mt19937 * Population::random_engine(void)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  size_t __i;
  long lVar4;
  
  if (random_engine()::random_device == '\0') {
    iVar1 = __cxa_guard_acquire(&random_engine()::random_device);
    if (iVar1 != 0) {
      std::random_device::random_device(&random_engine::random_device);
      __cxa_atexit(std::random_device::~random_device,&random_engine::random_device,&__dso_handle);
      __cxa_guard_release(&random_engine()::random_device);
    }
  }
  if (random_engine()::smt == '\0') {
    iVar1 = __cxa_guard_acquire(&random_engine()::smt);
    if (iVar1 != 0) {
      uVar2 = std::random_device::_M_getval();
      uVar3 = (ulong)uVar2;
      lVar4 = 1;
      random_engine::smt._M_x[0] = uVar3;
      do {
        uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
        random_engine::smt._M_x[lVar4] = uVar3;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x270);
      random_engine::smt._M_p = 0x270;
      __cxa_guard_release(&random_engine()::smt);
    }
  }
  return &random_engine::smt;
}

Assistant:

std::mt19937& Population::random_engine() {
    static std::random_device random_device;
    static std::mt19937 smt(random_device());
    return smt;
}